

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariablePowerGeneralizationImpl.hpp
# Opt level: O2

Monom<Kernel::NumTraits<Kernel::RealConstantType>_> * __thiscall
Inferences::VariablePowerGeneralizationImpl::Generalize::operator()
          (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *__return_storage_ptr__,
          Generalize *this,Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *p,
          PolyNf *evaluatedArgs)

{
  uint i;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_d8;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_b8;
  RationalConstantType local_a8;
  PolyNf *evaluatedArgs_local;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_80;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariablePowerGeneralizationImpl_hpp:80:17),_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_60;
  
  i = 0;
  evaluatedArgs_local = evaluatedArgs;
  Kernel::RationalConstantType::RationalConstantType(&local_a8,(RationalConstantType *)p);
  local_60._iter._inner._func.a =
       (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)(p->factors)._ptr;
  local_60._iter._inner._inner._to =
       ((long)(local_60._iter._inner._func.a)->_cursor -
       (long)(local_60._iter._inner._func.a)->_stack) / 0x1c;
  local_60._iter._inner._inner._next = 0;
  local_60._iter._inner._inner._from = 0;
  local_60._iter._func.this = this;
  local_60._iter._func.evaluatedArgs = &evaluatedArgs_local;
  local_60._iter._func.i = &i;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariablePowerGeneralizationImpl.hpp:80:17),_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::collect<Lib::Stack>(&local_d8,&local_60);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
            (&local_80,&local_d8);
  Lib::
  perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
            ((Lib *)&local_b8,
             (MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_80);
  Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
            (__return_storage_ptr__,(Numeral *)&local_a8,&local_b8);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_80);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_d8);
  Kernel::RationalConstantType::~RationalConstantType(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Monom<RealTraits> operator()(Monom<RealTraits> p, PolyNf* evaluatedArgs)  
  {
    unsigned i = 0;
    return Monom<RealTraits>(
        p.numeral, 
        perfect(MonomFactors<RealTraits>(
          p.factors->iter()
           .map([&](MonomFactor<RealTraits> m) 
             { 
                auto var = m.term.tryVar();
                if (var.isSome() && !powers.get(var.unwrap()).isBot()) {
                  ASS_EQ(evaluatedArgs[i], var.unwrap());
                  return MonomFactor<RealTraits>(evaluatedArgs[i++], 2 - ( m.power % 2 ));
                } else {
                  return MonomFactor<RealTraits>(evaluatedArgs[i++], m.power); 
                }
              })
           .template collect<Stack>())));
  }